

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::PipelinePopper::~PipelinePopper(PipelinePopper *this)

{
  pointer *pppPVar1;
  element_type *peVar2;
  Pipeline *pPVar3;
  Count *pCVar4;
  pointer ppPVar5;
  Pl_MD5 *pPVar6;
  Count *pCVar7;
  Pl_MD5 *pPVar8;
  
  if (this->stack_id == 0) {
    return;
  }
  peVar2 = (this->qw->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((ulong)((long)(peVar2->pipeline_stack).
                    super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             *(long *)&(peVar2->pipeline_stack).
                       super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
                       super__Vector_impl_data) < 9) {
    __assert_fail("qw->m->pipeline_stack.size() >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFWriter.cc"
                  ,0x3be,"QPDFWriter::PipelinePopper::~PipelinePopper()");
  }
  ::qpdf::pl::Count::finish(peVar2->pipeline);
  peVar2 = (this->qw->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pPVar3 = (peVar2->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1];
  if (pPVar3 == (Pipeline *)0x0) {
    pCVar7 = (Count *)0x0;
  }
  else {
    pCVar7 = (Count *)__dynamic_cast(pPVar3,&Pipeline::typeinfo,&::qpdf::pl::Count::typeinfo,0);
  }
  pCVar4 = peVar2->pipeline;
  if (pCVar7 != pCVar4) {
    __assert_fail("dynamic_cast<pl::Count*>(qw->m->pipeline_stack.back()) == qw->m->pipeline",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFWriter.cc"
                  ,0x3c0,"QPDFWriter::PipelinePopper::~PipelinePopper()");
  }
  if (pCVar4->id_ != this->stack_id) {
    __assert_fail("qw->m->pipeline->id() == stack_id",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFWriter.cc"
                  ,0x3c5,"QPDFWriter::PipelinePopper::~PipelinePopper()");
  }
  if (pPVar3 != (Pipeline *)0x0) {
    (*pPVar3->_vptr_Pipeline[1])(pPVar3);
  }
  pppPVar1 = &(((this->qw->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  *pppPVar1 = *pppPVar1 + -1;
  do {
    peVar2 = (this->qw->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    ppPVar5 = (peVar2->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pPVar6 = (Pl_MD5 *)ppPVar5[-1];
    if (pPVar6 == (Pl_MD5 *)0x0) {
LAB_0023efce:
      pPVar8 = (Pl_MD5 *)0x0;
    }
    else {
      pCVar7 = (Count *)__dynamic_cast(pPVar6,&Pipeline::typeinfo,&::qpdf::pl::Count::typeinfo,0);
      if (pCVar7 != (Count *)0x0) {
        peVar2->pipeline = pCVar7;
        return;
      }
      if ((pPVar6 == (Pl_MD5 *)0x0) ||
         (pPVar8 = pPVar6,
         (pPVar6->super_Pipeline)._vptr_Pipeline != (_func_int **)&PTR__Pl_MD5_00343100))
      goto LAB_0023efce;
    }
    if (pPVar8 == peVar2->md5_pipeline) {
      peVar2->md5_pipeline = (Pl_MD5 *)0x0;
    }
    (peVar2->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar5 + -1;
    if (pPVar6 != (Pl_MD5 *)0x0) {
      (*(pPVar6->super_Pipeline)._vptr_Pipeline[1])(pPVar6);
    }
  } while( true );
}

Assistant:

QPDFWriter::PipelinePopper::~PipelinePopper()
{
    if (!stack_id) {
        return;
    }
    qpdf_assert_debug(qw->m->pipeline_stack.size() >= 2);
    qw->m->pipeline->finish();
    qpdf_assert_debug(dynamic_cast<pl::Count*>(qw->m->pipeline_stack.back()) == qw->m->pipeline);
    // It might be possible for this assertion to fail if writeLinearized exits by exception when
    // deterministic ID, but I don't think so. As of this writing, this is the only case in which
    // two dynamically allocated PipelinePopper objects ever exist at the same time, so the
    // assertion will fail if they get popped out of order from automatic destruction.
    qpdf_assert_debug(qw->m->pipeline->id() == stack_id);
    delete qw->m->pipeline_stack.back();
    qw->m->pipeline_stack.pop_back();
    while (!dynamic_cast<pl::Count*>(qw->m->pipeline_stack.back())) {
        Pipeline* p = qw->m->pipeline_stack.back();
        if (dynamic_cast<Pl_MD5*>(p) == qw->m->md5_pipeline) {
            qw->m->md5_pipeline = nullptr;
        }
        qw->m->pipeline_stack.pop_back();
        delete p;
    }
    qw->m->pipeline = dynamic_cast<pl::Count*>(qw->m->pipeline_stack.back());
}